

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatastream.h
# Opt level: O2

QDataStream *
QtPrivate::readArrayBasedContainer<QList<QWidgetItemData>>(QDataStream *s,QList<QWidgetItemData> *c)

{
  QDataStream QVar1;
  qint64 asize;
  long lVar2;
  long in_FS_OFFSET;
  undefined1 local_78 [24];
  QWidgetItemData local_60;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_78._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_78._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  StreamStateSaver::StreamStateSaver((StreamStateSaver *)local_78,s);
  QList<QWidgetItemData>::clear(c);
  asize = QDataStream::readQSizeType(s);
  if (asize < 0) {
    QDataStream::setStatus((Status)s);
  }
  else {
    QList<QWidgetItemData>::reserve(c,asize);
    lVar2 = asize + 1;
    do {
      lVar2 = lVar2 + -1;
      if (lVar2 == 0) break;
      local_60.role = -1;
      local_60._4_4_ = 0xaaaaaaaa;
      local_60.value.d.data.shared = (PrivateShared *)0x0;
      local_60.value.d.data._8_8_ = 0;
      local_60.value.d.data._16_8_ = 0;
      local_60.value.d._24_8_ = 2;
      ::operator>>(s,&local_60);
      QVar1 = s[0x13];
      if (QVar1 == (QDataStream)0x0) {
        QList<QWidgetItemData>::emplaceBack<QWidgetItemData_const&>(c,&local_60);
      }
      else {
        QList<QWidgetItemData>::clear(c);
      }
      ::QVariant::~QVariant(&local_60.value);
    } while (QVar1 == (QDataStream)0x0);
  }
  StreamStateSaver::~StreamStateSaver((StreamStateSaver *)local_78);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return s;
}

Assistant:

QDataStream &readArrayBasedContainer(QDataStream &s, Container &c)
{
    StreamStateSaver stateSaver(&s);

    c.clear();
    qint64 size = QDataStream::readQSizeType(s);
    qsizetype n = size;
    if (size != n || size < 0) {
        s.setStatus(QDataStream::SizeLimitExceeded);
        return s;
    }
    c.reserve(n);
    for (qsizetype i = 0; i < n; ++i) {
        typename Container::value_type t;
        s >> t;
        if (s.status() != QDataStream::Ok) {
            c.clear();
            break;
        }
        c.append(t);
    }

    return s;
}